

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::FreeZeroObjVariablePS::FreeZeroObjVariablePS
          (FreeZeroObjVariablePS *this,SPxLPBase<double> *lp,int _j,bool loFree,
          DSVectorBase<double> *col_idx_sorted,shared_ptr<soplex::Tolerances> *tols)

{
  int iVar1;
  double *pdVar2;
  SVectorBase<double> *pSVar3;
  byte in_CL;
  undefined4 in_EDX;
  int __c;
  undefined8 *in_RDI;
  int r;
  int k;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  SPxLPBase<double> *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeac;
  DSVectorBase<double> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  double local_b8;
  uint local_48;
  
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffea0,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2c1ece);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2c1ee4);
  PostStep::PostStep((PostStep *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     in_stack_fffffffffffffeb8,
                     (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffeb0,
                     in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2c1f2d);
  *in_RDI = &PTR__FreeZeroObjVariablePS_004ecfe0;
  *(undefined4 *)(in_RDI + 5) = in_EDX;
  iVar1 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2c1f66);
  *(int *)((long)in_RDI + 0x2c) = iVar1 + -1;
  iVar1 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2c1fa3);
  *(int *)(in_RDI + 6) = iVar1 + -1;
  if ((in_CL & 1) == 0) {
    pdVar2 = SPxLPBase<double>::lower(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    local_b8 = *pdVar2;
  }
  else {
    pdVar2 = SPxLPBase<double>::upper(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    local_b8 = *pdVar2;
  }
  in_RDI[7] = local_b8;
  DSVectorBase<double>::DSVectorBase
            ((DSVectorBase<double> *)in_stack_fffffffffffffea0,
             (DSVectorBase<double> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  pSVar3 = SPxLPBase<double>::colVector(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
  SVectorBase<double>::size(pSVar3);
  DSVectorBase<double>::DSVectorBase(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  pSVar3 = SPxLPBase<double>::colVector(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
  SVectorBase<double>::size(pSVar3);
  DSVectorBase<double>::DSVectorBase(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  pSVar3 = SPxLPBase<double>::colVector(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
  SVectorBase<double>::size(pSVar3);
  Array<soplex::DSVectorBase<double>_>::Array
            ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffeac);
  *(byte *)(in_RDI + 0x17) = in_CL & 1;
  local_48 = 0;
  do {
    iVar1 = SVectorBase<double>::size((SVectorBase<double> *)(in_RDI + 9));
    if (iVar1 <= (int)local_48) {
      return;
    }
    SVectorBase<double>::index((SVectorBase<double> *)(in_RDI + 9),(char *)(ulong)local_48,__c);
    if ((*(byte *)(in_RDI + 0x17) & 1) == 0) {
LAB_002c2224:
      if ((*(byte *)(in_RDI + 0x17) & 1) == 0) {
        pdVar2 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 9),local_48);
        if (*pdVar2 <= 0.0 && *pdVar2 != 0.0) goto LAB_002c226a;
      }
      SPxLPBase<double>::lhs(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      DSVectorBase<double>::add
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
                 (double *)in_stack_fffffffffffffea0);
    }
    else {
      pdVar2 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 9),local_48);
      if (*pdVar2 <= 0.0) goto LAB_002c2224;
LAB_002c226a:
      SPxLPBase<double>::rhs(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      DSVectorBase<double>::add
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
                 (double *)in_stack_fffffffffffffea0);
    }
    in_stack_fffffffffffffeb0 =
         (DSVectorBase<double> *)
         SPxLPBase<double>::rowVector(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    Array<soplex::DSVectorBase<double>_>::operator[]
              ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe9c);
    DSVectorBase<double>::operator=
              ((DSVectorBase<double> *)in_stack_fffffffffffffea0,
               (SVectorBase<double> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
    ;
    in_stack_fffffffffffffea0 = (SPxLPBase<double> *)(in_RDI + 0x10);
    in_stack_fffffffffffffeac = local_48;
    SPxLPBase<double>::rowObj
              ((SPxLPBase<double> *)CONCAT44(local_48,in_stack_fffffffffffffea8),
               (int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
    DSVectorBase<double>::add
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
               (double *)in_stack_fffffffffffffea0);
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

FreeZeroObjVariablePS(const SPxLPBase<R>& lp, int _j, bool loFree,
                            DSVectorBase<R> col_idx_sorted, std::shared_ptr<Tolerances> tols)
         : PostStep("FreeZeroObjVariable", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_old_j(lp.nCols() - 1)
         , m_old_i(lp.nRows() - 1)
         , m_bnd(loFree ? lp.upper(_j) : lp.lower(_j))
         , m_col(col_idx_sorted)
         , m_lRhs(lp.colVector(_j).size())
         , m_rowObj(lp.colVector(_j).size())
         , m_rows(lp.colVector(_j).size())
         , m_loFree(loFree)
      {
         for(int k = 0; k < m_col.size(); ++k)
         {
            int r = m_col.index(k);

            if((m_loFree  && m_col.value(k) > 0) ||
                  (!m_loFree && m_col.value(k) < 0))
               m_lRhs.add(k, lp.rhs(r));
            else
               m_lRhs.add(k, lp.lhs(r));

            m_rows[k] = lp.rowVector(r);
            m_rowObj.add(k, lp.rowObj(r));
         }
      }